

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O0

int ARKStepSetTables(void *arkode_mem,int q,int p,ARKodeButcherTable Bi,ARKodeButcherTable Be)

{
  long lVar1;
  long lVar2;
  int iVar3;
  ARKodeButcherTable pAVar4;
  undefined4 *in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  ARKodeButcherTable in_R8;
  sunindextype Bliw;
  sunindextype Blrw;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  int retval;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  ARKodeButcherTable in_stack_ffffffffffffffc0;
  ARKodeMem in_stack_ffffffffffffffc8;
  int local_4;
  
  local_4 = arkStep_AccessStepMem
                      (in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,
                       (ARKodeMem *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                       (ARKodeARKStepMem *)0xe87076);
  if (local_4 == 0) {
    if ((in_RCX == (undefined4 *)0x0) && (in_R8 == (ARKodeButcherTable)0x0)) {
      arkProcessError(in_stack_ffffffffffffffc8,-0x15,"ARKode::ARKStep","ARKStepSetTables",
                      "At least one complete table must be supplied");
      local_4 = -0x16;
    }
    else if ((in_RCX == (undefined4 *)0x0) ||
            ((in_R8 == (ARKodeButcherTable)0x0 || (in_RCX[2] == in_R8->stages)))) {
      *(undefined4 *)((long)&in_stack_ffffffffffffffc0[1].d + 4) = 0;
      *(undefined4 *)&in_stack_ffffffffffffffc0[1].b = 0;
      *(undefined4 *)((long)&in_stack_ffffffffffffffc0[1].b + 4) = 0;
      ARKodeButcherTable_Space
                (*(ARKodeButcherTable *)(in_stack_ffffffffffffffc0 + 2),
                 (sunindextype *)&stack0xffffffffffffffb8,(sunindextype *)&stack0xffffffffffffffbc);
      ARKodeButcherTable_Free(in_stack_ffffffffffffffc0);
      in_stack_ffffffffffffffc0[2].q = 0;
      in_stack_ffffffffffffffc0[2].p = 0;
      in_stack_ffffffffffffffc8->liw =
           in_stack_ffffffffffffffc8->liw - (long)in_stack_ffffffffffffffb8;
      in_stack_ffffffffffffffc8->lrw =
           in_stack_ffffffffffffffc8->lrw - (long)in_stack_ffffffffffffffbc;
      ARKodeButcherTable_Space
                (*(ARKodeButcherTable *)&in_stack_ffffffffffffffc0[2].stages,
                 (sunindextype *)&stack0xffffffffffffffb8,(sunindextype *)&stack0xffffffffffffffbc);
      ARKodeButcherTable_Free(in_stack_ffffffffffffffc0);
      *(undefined8 *)&in_stack_ffffffffffffffc0[2].stages = 0;
      in_stack_ffffffffffffffc8->liw =
           in_stack_ffffffffffffffc8->liw - (long)in_stack_ffffffffffffffb8;
      in_stack_ffffffffffffffc8->lrw =
           in_stack_ffffffffffffffc8->lrw - (long)in_stack_ffffffffffffffbc;
      if (in_RCX == (undefined4 *)0x0) {
        *(int *)((long)&in_stack_ffffffffffffffc0[1].d + 4) = in_R8->stages;
        *(int *)&in_stack_ffffffffffffffc0[1].b = in_R8->q;
        *(int *)((long)&in_stack_ffffffffffffffc0[1].b + 4) = in_R8->p;
        pAVar4 = ARKodeButcherTable_Copy(in_R8);
        *(ARKodeButcherTable *)(in_stack_ffffffffffffffc0 + 2) = pAVar4;
        lVar1._0_4_ = in_stack_ffffffffffffffc0[2].q;
        lVar1._4_4_ = in_stack_ffffffffffffffc0[2].p;
        if (lVar1 == 0) {
          arkProcessError(in_stack_ffffffffffffffc8,-0x15,"ARKode::ARKStep","ARKStepSetTables",
                          "arkode_mem = NULL illegal.");
          return -0x15;
        }
        iVar3 = ARKStepSetExplicit(in_stack_ffffffffffffffc8);
        if (iVar3 != 0) {
          arkProcessError(in_stack_ffffffffffffffc8,-0x16,"ARKode::ARKStep","ARKStepSetTables",
                          "Error in ARKStepSetExplicit");
          return iVar3;
        }
      }
      else if (in_R8 == (ARKodeButcherTable)0x0) {
        *(undefined4 *)((long)&in_stack_ffffffffffffffc0[1].d + 4) = in_RCX[2];
        *(undefined4 *)&in_stack_ffffffffffffffc0[1].b = *in_RCX;
        *(undefined4 *)((long)&in_stack_ffffffffffffffc0[1].b + 4) = in_RCX[1];
        pAVar4 = ARKodeButcherTable_Copy((ARKodeButcherTable)0x0);
        *(ARKodeButcherTable *)&in_stack_ffffffffffffffc0[2].stages = pAVar4;
        if (*(long *)&in_stack_ffffffffffffffc0[2].stages == 0) {
          arkProcessError(in_stack_ffffffffffffffc8,-0x15,"ARKode::ARKStep","ARKStepSetTables",
                          "arkode_mem = NULL illegal.");
          return -0x15;
        }
        iVar3 = ARKStepSetImplicit(in_stack_ffffffffffffffc8);
        if (iVar3 != 0) {
          arkProcessError(in_stack_ffffffffffffffc8,-0x16,"ARKode::ARKStep","ARKStepSetTables",
                          "Error in ARKStepSetImplicit");
          return -0x16;
        }
      }
      else {
        *(undefined4 *)((long)&in_stack_ffffffffffffffc0[1].d + 4) = in_RCX[2];
        *(undefined4 *)&in_stack_ffffffffffffffc0[1].b = in_ESI;
        *(undefined4 *)((long)&in_stack_ffffffffffffffc0[1].b + 4) = in_EDX;
        pAVar4 = ARKodeButcherTable_Copy(in_R8);
        *(ARKodeButcherTable *)(in_stack_ffffffffffffffc0 + 2) = pAVar4;
        lVar2._0_4_ = in_stack_ffffffffffffffc0[2].q;
        lVar2._4_4_ = in_stack_ffffffffffffffc0[2].p;
        if (lVar2 == 0) {
          arkProcessError(in_stack_ffffffffffffffc8,-0x15,"ARKode::ARKStep","ARKStepSetTables",
                          "arkode_mem = NULL illegal.");
          return -0x15;
        }
        pAVar4 = ARKodeButcherTable_Copy(in_R8);
        *(ARKodeButcherTable *)&in_stack_ffffffffffffffc0[2].stages = pAVar4;
        if (*(long *)&in_stack_ffffffffffffffc0[2].stages == 0) {
          arkProcessError(in_stack_ffffffffffffffc8,-0x15,"ARKode::ARKStep","ARKStepSetTables",
                          "arkode_mem = NULL illegal.");
          return -0x15;
        }
        iVar3 = ARKStepSetImEx(in_stack_ffffffffffffffc8);
        if (iVar3 != 0) {
          arkProcessError(in_stack_ffffffffffffffc8,-0x16,"ARKode::ARKStep","ARKStepSetTables",
                          "Error in ARKStepSetImEx");
          return -0x16;
        }
      }
      ARKodeButcherTable_Space
                (*(ARKodeButcherTable *)(in_stack_ffffffffffffffc0 + 2),
                 (sunindextype *)&stack0xffffffffffffffb8,(sunindextype *)&stack0xffffffffffffffbc);
      in_stack_ffffffffffffffc8->liw =
           (long)in_stack_ffffffffffffffb8 + in_stack_ffffffffffffffc8->liw;
      in_stack_ffffffffffffffc8->lrw =
           (long)in_stack_ffffffffffffffbc + in_stack_ffffffffffffffc8->lrw;
      ARKodeButcherTable_Space
                (*(ARKodeButcherTable *)&in_stack_ffffffffffffffc0[2].stages,
                 (sunindextype *)&stack0xffffffffffffffb8,(sunindextype *)&stack0xffffffffffffffbc);
      in_stack_ffffffffffffffc8->liw =
           (long)in_stack_ffffffffffffffb8 + in_stack_ffffffffffffffc8->liw;
      in_stack_ffffffffffffffc8->lrw =
           (long)in_stack_ffffffffffffffbc + in_stack_ffffffffffffffc8->lrw;
      local_4 = 0;
    }
    else {
      arkProcessError(in_stack_ffffffffffffffc8,-0x15,"ARKode::ARKStep","ARKStepSetTables",
                      "Both tables must have the same number of stages");
      local_4 = -0x16;
    }
  }
  return local_4;
}

Assistant:

int ARKStepSetTables(void *arkode_mem, int q, int p,
                     ARKodeButcherTable Bi, ARKodeButcherTable Be)
{
  int retval;
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  sunindextype Blrw, Bliw;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "ARKStepSetTables",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* check for illegal inputs */
  if ((Bi == NULL) && (Be == NULL)) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ARKStep",
                    "ARKStepSetTables",
                    "At least one complete table must be supplied");
    return(ARK_ILL_INPUT);
  }

  /* if both tables are set, check that they have the same number of stages */
  if ((Bi != NULL) && (Be != NULL)) {
    if (Bi->stages != Be->stages) {
      arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ARKStep",
                      "ARKStepSetTables",
                      "Both tables must have the same number of stages");
      return(ARK_ILL_INPUT);
    }
  }

  /* clear any existing parameters and Butcher tables */
  step_mem->stages = 0;
  step_mem->q = 0;
  step_mem->p = 0;

  ARKodeButcherTable_Space(step_mem->Be, &Bliw, &Blrw);
  ARKodeButcherTable_Free(step_mem->Be);
  step_mem->Be = NULL;
  ark_mem->liw -= Bliw;
  ark_mem->lrw -= Blrw;

  ARKodeButcherTable_Space(step_mem->Bi, &Bliw, &Blrw);
  ARKodeButcherTable_Free(step_mem->Bi);
  step_mem->Bi = NULL;
  ark_mem->liw -= Bliw;
  ark_mem->lrw -= Blrw;

  /*
   * determine mode (implicit/explicit/ImEx), and perform appropriate actions
   */

  /* explicit */
  if (Bi == NULL) {

    /* set the relevant parameters (use table q and p) */
    step_mem->stages = Be->stages;
    step_mem->q = Be->q;
    step_mem->p = Be->p;

    /* copy the table in step memory */
    step_mem->Be = ARKodeButcherTable_Copy(Be);
    if (step_mem->Be == NULL) {
      arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ARKStep",
                      "ARKStepSetTables", MSG_ARK_NO_MEM);
      return(ARK_MEM_NULL);
    }

    /* set method as purely explicit */
    retval = ARKStepSetExplicit(arkode_mem);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                      "ARKStepSetTables",
                      "Error in ARKStepSetExplicit");
      return(retval);
    }

  /* implicit */
  } else if (Be == NULL) {

    /* set the relevant parameters (use table q and p) */
    step_mem->stages = Bi->stages;
    step_mem->q = Bi->q;
    step_mem->p = Bi->p;

    /* copy the table in step memory */
    step_mem->Bi = ARKodeButcherTable_Copy(Bi);
    if (step_mem->Bi == NULL) {
      arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ARKStep",
                      "ARKStepSetTables", MSG_ARK_NO_MEM);
      return(ARK_MEM_NULL);
    }

    /* set method as purely implicit */
    retval = ARKStepSetImplicit(arkode_mem);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                      "ARKStepSetTables",
                      "Error in ARKStepSetImplicit");
      return(ARK_ILL_INPUT);
    }

  /* ImEx */
  } else {

    /* set the relevant parameters (use input q and p) */
    step_mem->stages = Bi->stages;
    step_mem->q = q;
    step_mem->p = p;

    /* copy the explicit table into step memory */
    step_mem->Be = ARKodeButcherTable_Copy(Be);
    if (step_mem->Be == NULL) {
      arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ARKStep",
                      "ARKStepSetTables", MSG_ARK_NO_MEM);
      return(ARK_MEM_NULL);
    }

    /* copy the implicit table into step memory */
    step_mem->Bi = ARKodeButcherTable_Copy(Bi);
    if (step_mem->Bi == NULL) {
      arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ARKStep",
                      "ARKStepSetTables", MSG_ARK_NO_MEM);
      return(ARK_MEM_NULL);
    }

    /* set method as ImEx */
    retval = ARKStepSetImEx(arkode_mem);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                      "ARKStepSetTables",
                      "Error in ARKStepSetImEx");
      return(ARK_ILL_INPUT);
    }
  }

  /* note Butcher table space requirements */
  ARKodeButcherTable_Space(step_mem->Be, &Bliw, &Blrw);
  ark_mem->liw += Bliw;
  ark_mem->lrw += Blrw;

  ARKodeButcherTable_Space(step_mem->Bi, &Bliw, &Blrw);
  ark_mem->liw += Bliw;
  ark_mem->lrw += Blrw;

  return(ARK_SUCCESS);
}